

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O3

void __thiscall Liby::Socket::Socket(Socket *this,fdPtr *fp,bool isUdp_)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  this->isUdp_ = isUdp_;
  peVar1 = (fp->super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this->fd_ = peVar1->fd_;
  (this->fp_).super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  p_Var2 = (fp->super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (this->fp_).super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  (this->ep_).port_ = 0;
  (this->ep_).addr_ = 0;
  return;
}

Assistant:

Socket::Socket(const fdPtr &fp, bool isUdp_)
    : isUdp_(isUdp_), fd_(fp->fd()), fp_(fp) {}